

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O1

uint32_t __thiscall
olc::Renderer_OGL10::CreateTexture
          (Renderer_OGL10 *this,uint32_t width,uint32_t height,bool filtered)

{
  uint in_EAX;
  undefined3 in_register_00000009;
  undefined4 in_register_00000014;
  undefined8 uVar1;
  undefined8 uVar2;
  uint32_t id;
  undefined8 uStack_18;
  
  uStack_18 = (ulong)in_EAX;
  glGenTextures(1,(long)&uStack_18 + 4,CONCAT44(in_register_00000014,height));
  glBindTexture(0xde1,uStack_18._4_4_);
  if (CONCAT31(in_register_00000009,filtered) == 0) {
    glTexParameteri(0xde1,0x2800,0x2600);
    uVar2 = 0x2801;
    uVar1 = 0x2600;
  }
  else {
    glTexParameteri(0xde1,0x2801,0x2601);
    uVar2 = 0x2800;
    uVar1 = 0x2601;
  }
  glTexParameteri(0xde1,uVar2,uVar1);
  glTexParameteri(0xde1,0x2802,0x2900);
  glTexParameteri(0xde1,0x2803,0x2900);
  glTexEnvf(0x46040000,0x2300,0x2200);
  return uStack_18._4_4_;
}

Assistant:

uint32_t CreateTexture(const uint32_t width, const uint32_t height, const bool filtered) override
		{
			UNUSED(width);
			UNUSED(height);
			uint32_t id = 0;
			glGenTextures(1, &id);
			glBindTexture(GL_TEXTURE_2D, id);
			if (filtered)
			{
				glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
				glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
			}
			else
			{
				glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
				glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
			}

			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP);
			glTexEnvf(GL_TEXTURE_ENV, GL_TEXTURE_ENV_MODE, GL_MODULATE);
			return id;
		}